

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

void Diligent::PrintShaderCodeVariables
               (stringstream *ss,size_t LevelIdent,size_t IdentShift,ShaderCodeVariableDesc *pVars,
               Uint32 NumVars)

{
  bool bVar1;
  stringstream *psVar2;
  ShaderCodeVariableDesc *pSVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  char *pcVar7;
  ostream *poVar8;
  int iVar9;
  uint uVar10;
  Uint32 UVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  char local_9d [5];
  ulong local_98;
  ulong local_90;
  ulong local_88;
  stringstream *local_80;
  stringstream *local_78;
  ShaderCodeVariableDesc *local_70;
  size_t local_68;
  ulong local_60;
  size_t local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  if (NumVars != 0 && pVars != (ShaderCodeVariableDesc *)0x0) {
    local_78 = (stringstream *)CONCAT44(local_78._4_4_,NumVars);
    local_60 = (ulong)NumVars;
    uVar15 = 0;
    local_90 = 0;
    local_98 = local_98 & 0xffffffff00000000;
    local_88 = local_88 & 0xffffffff00000000;
    uVar13 = 0;
    uVar17 = 0;
    uVar14 = 0;
    local_80 = ss;
    local_70 = pVars;
    local_68 = IdentShift;
    local_58 = LevelIdent;
    do {
      if (local_70[uVar15].Name != (char *)0x0) {
        uVar5 = strlen(local_70[uVar15].Name);
        if ((int)uVar5 < (int)local_90) {
          uVar5 = local_90;
        }
        local_90 = uVar5 & 0xffffffff;
      }
      pSVar3 = local_70;
      if (local_70[uVar15].TypeName != (char *)0x0) {
        sVar6 = strlen(local_70[uVar15].TypeName);
        iVar9 = (int)sVar6;
        if ((int)sVar6 < (int)local_98) {
          iVar9 = (int)local_98;
        }
        local_98 = CONCAT44(local_98._4_4_,iVar9);
      }
      uVar4 = 1;
      iVar9 = 1;
      if (pSVar3[uVar15].ArraySize != 0) {
        iVar9 = 0;
        UVar11 = pSVar3[uVar15].ArraySize;
        do {
          iVar9 = iVar9 + 1;
          bVar1 = 9 < UVar11;
          UVar11 = UVar11 / 10;
        } while (bVar1);
      }
      iVar12 = (int)local_88;
      if ((int)local_88 <= iVar9) {
        iVar12 = iVar9;
      }
      local_88 = CONCAT44(local_88._4_4_,iVar12);
      if (pSVar3[uVar15].Offset != 0) {
        uVar4 = 0;
        uVar10 = pSVar3[uVar15].Offset;
        do {
          uVar4 = uVar4 + 1;
          bVar1 = 9 < uVar10;
          uVar10 = uVar10 / 10;
        } while (bVar1);
      }
      if ((int)uVar13 <= (int)uVar4) {
        uVar13 = uVar4;
      }
      pcVar7 = GetShaderCodeVariableClassString(pSVar3[uVar15].Class);
      sVar6 = strlen(pcVar7);
      if ((int)uVar17 <= (int)(uint)sVar6) {
        uVar17 = (uint)sVar6;
      }
      pcVar7 = GetShaderCodeBasicTypeString(pSVar3[uVar15].BasicType);
      sVar6 = strlen(pcVar7);
      pSVar3 = local_70;
      if ((int)uVar14 <= (int)(uint)sVar6) {
        uVar14 = (uint)sVar6;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != local_60);
    if ((int)local_78 != 0) {
      local_78 = local_80 + 0x10;
      local_38 = (long)((int)local_90 + (int)local_58);
      local_98 = local_98 & 0xffffffff;
      local_40 = (ulong)uVar17;
      local_48 = (ulong)uVar14;
      local_88 = local_88 & 0xffffffff;
      local_50 = (ulong)uVar13;
      uVar15 = local_90 & 0xffffffff;
      lVar16 = local_58 + local_68;
      local_90 = local_60 * 0x28;
      lVar18 = 0;
      do {
        *(long *)(local_80 + *(long *)(*(long *)(local_80 + 0x10) + -0x18) + 0x20) = local_38;
        pcVar7 = *(char **)((long)&pSVar3->Name + lVar18);
        if (pcVar7 == (char *)0x0) {
          pcVar7 = "?";
        }
        sVar6 = strlen(pcVar7);
        psVar2 = local_78;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_78,pcVar7,sVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar2,": ",2);
        *(ulong *)(local_80 + *(long *)(*(long *)(local_80 + 0x10) + -0x18) + 0x20) = local_98;
        pcVar7 = *(char **)((long)&pSVar3->TypeName + lVar18);
        if (pcVar7 == (char *)0x0) {
          pcVar7 = "";
        }
        sVar6 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar2,pcVar7,sVar6);
        local_9d[0] = ' ';
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar2,local_9d,1);
        *(ulong *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = local_40;
        pcVar7 = GetShaderCodeVariableClassString((&pSVar3->Class)[lVar18]);
        sVar6 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar6);
        local_9d[1] = 0x20;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_9d + 1,1);
        *(ulong *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = local_48;
        pcVar7 = GetShaderCodeBasicTypeString((&pSVar3->BasicType)[lVar18]);
        sVar6 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar6);
        local_9d[2] = 0x20;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_9d + 2,1);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        local_9d[3] = 0x78;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_9d + 3,1);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," [",2);
        *(ulong *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = local_88;
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        local_9d[4] = 0x5d;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_9d + 4,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," offset: ",9);
        *(ulong *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = local_50;
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        PrintShaderCodeVariables
                  (local_80,lVar16 + uVar15,local_68,
                   *(ShaderCodeVariableDesc **)((long)&pSVar3->pMembers + lVar18),
                   *(Uint32 *)((long)&pSVar3->NumMembers + lVar18));
        lVar18 = lVar18 + 0x28;
      } while (local_90 != lVar18);
    }
  }
  return;
}

Assistant:

static void PrintShaderCodeVariables(std::stringstream& ss, size_t LevelIdent, size_t IdentShift, const ShaderCodeVariableDesc* pVars, Uint32 NumVars)
{
    if (pVars == nullptr || NumVars == 0)
        return;

    int MaxNameLen      = 0;
    int MaxTypeLen      = 0;
    int MaxArraySizeLen = 0;
    int MaxOffsetLen    = 0;
    int MaxClassLen     = 0;
    int MaxBasicTypeLen = 0;
    for (Uint32 i = 0; i < NumVars; ++i)
    {
        const ShaderCodeVariableDesc& Var = pVars[i];
        if (Var.Name != nullptr)
            MaxNameLen = std::max(MaxNameLen, static_cast<int>(strlen(Var.Name)));
        if (Var.TypeName != nullptr)
            MaxTypeLen = std::max(MaxTypeLen, static_cast<int>(strlen(Var.TypeName)));
        MaxArraySizeLen = std::max(MaxArraySizeLen, static_cast<int>(GetPrintWidth(Var.ArraySize)));
        MaxOffsetLen    = std::max(MaxOffsetLen, static_cast<int>(GetPrintWidth(Var.Offset)));
        MaxClassLen     = std::max(MaxClassLen, static_cast<int>(strlen(GetShaderCodeVariableClassString(Var.Class))));
        MaxBasicTypeLen = std::max(MaxBasicTypeLen, static_cast<int>(strlen(GetShaderCodeBasicTypeString(Var.BasicType))));
    }

    for (Uint32 i = 0; i < NumVars; ++i)
    {
        const ShaderCodeVariableDesc& Var = pVars[i];
        ss << std::setw(static_cast<int>(LevelIdent) + MaxNameLen) << (Var.Name ? Var.Name : "?")
           << ": " << std::setw(MaxTypeLen) << (Var.TypeName ? Var.TypeName : "")
           << ' ' << std::setw(MaxClassLen) << GetShaderCodeVariableClassString(Var.Class)
           << ' ' << std::setw(MaxBasicTypeLen) << GetShaderCodeBasicTypeString(Var.BasicType)
           << ' ' << Uint32{Var.NumRows} << 'x' << Uint32{Var.NumColumns} << " [" << std::setw(MaxArraySizeLen) << Var.ArraySize << ']'
           << " offset: " << std::setw(MaxOffsetLen) << Var.Offset << std::endl;

        PrintShaderCodeVariables(ss, LevelIdent + MaxNameLen + IdentShift, IdentShift, Var.pMembers, Var.NumMembers);
    }
}